

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationShaderInputOutputTests.cpp
# Opt level: O1

TestStatus *
vkt::tessellation::anon_unknown_1::PatchVertexCount::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDefinition *caseDef)

{
  pointer vertexData_00;
  int iVar1;
  int iVar2;
  VkDeviceSize vertexDataSizeBytes;
  float fVar3;
  vector<float,_std::allocator<float>_> vertexData;
  TextureLevel referenceImage;
  ConstPixelBufferAccess local_58;
  
  vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::reserve(&vertexData,(long)caseDef->inPatchSize);
  iVar1 = caseDef->inPatchSize;
  if (0 < iVar1) {
    iVar2 = 0;
    do {
      fVar3 = (float)iVar2 / (float)(iVar1 + -1);
      referenceImage.m_format.order = (ChannelOrder)(fVar3 * fVar3);
      if (vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&vertexData,
                   (iterator)
                   vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,(float *)&referenceImage);
      }
      else {
        *vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish = (float)referenceImage.m_format.order;
        vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_finish = vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      iVar2 = iVar2 + 1;
      iVar1 = caseDef->inPatchSize;
    } while (iVar2 < iVar1);
  }
  vertexDataSizeBytes =
       (long)vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  tcu::TextureLevel::TextureLevel(&referenceImage);
  tcu::ImageIO::loadPNG
            (&referenceImage,context->m_testCtx->m_curArchive,
             (caseDef->referenceImagePath)._M_dataplus._M_p);
  vertexData_00 =
       vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start;
  iVar1 = caseDef->inPatchSize;
  iVar2 = caseDef->outPatchSize;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_58,&referenceImage);
  runTest(__return_storage_ptr__,context,1,iVar1,iVar2,VK_FORMAT_R32_SFLOAT,vertexData_00,
          vertexDataSizeBytes,&local_58);
  tcu::TextureLevel::~TextureLevel(&referenceImage);
  if (vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vertexData.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDefinition caseDef)
{
	// Input vertex attribute data
	std::vector<float> vertexData;
	vertexData.reserve(caseDef.inPatchSize);
	for (int i = 0; i < caseDef.inPatchSize; ++i)
	{
		const float f = static_cast<float>(i) / static_cast<float>(caseDef.inPatchSize - 1);
		vertexData.push_back(f*f);
	}
	const VkDeviceSize vertexBufferSize = sizeof(float) * vertexData.size();

	// Load reference image
	tcu::TextureLevel referenceImage;
	tcu::ImageIO::loadPNG(referenceImage, context.getTestContext().getArchive(), caseDef.referenceImagePath.c_str());

	const int numPrimitives = 1;

	return runTest(context, numPrimitives, caseDef.inPatchSize, caseDef.outPatchSize,
				   VK_FORMAT_R32_SFLOAT, &vertexData[0], vertexBufferSize, referenceImage.getAccess());
}